

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compute_variance.cpp
# Opt level: O2

void brent_kung_prefix_sum(vfloat4 *d,size_t items,int stride)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  vfloat4 *pvVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (1 < items) {
    lVar3 = (long)stride;
    uVar5 = 2;
    bVar4 = 1;
    do {
      uVar6 = items >> (bVar4 & 0x3f);
      lVar7 = (uVar5 - 1) * lVar3 * 0x10;
      pvVar9 = d;
      while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
        pfVar1 = (float *)((long)pvVar9->m + lVar7);
        pfVar2 = (float *)((long)pvVar9->m + (uVar5 * 8 + -0x10) * lVar3);
        auVar11._0_4_ = *pfVar1 + *pfVar2;
        auVar11._4_4_ = pfVar1[1] + pfVar2[1];
        auVar11._8_4_ = pfVar1[2] + pfVar2[2];
        auVar11._12_4_ = pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])((long)pvVar9->m + lVar7) = auVar11;
        pvVar9 = pvVar9 + (stride << (bVar4 & 0x1f));
      }
      bVar4 = bVar4 + 1;
      uVar5 = uVar5 * 2;
    } while (uVar5 <= items);
    do {
      bVar4 = bVar4 - 1;
      uVar6 = uVar5 >> 1;
      uVar8 = items - (uVar5 >> 2) >> (bVar4 & 0x3f);
      lVar7 = (uVar6 + (uVar5 >> 2) + -1) * lVar3 * 0x10;
      pvVar9 = d;
      while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
        pfVar1 = (float *)((long)pvVar9->m + lVar7);
        pfVar2 = (float *)((long)pvVar9->m + (uVar6 * 0x10 + -0x10) * lVar3);
        auVar12._0_4_ = *pfVar1 + *pfVar2;
        auVar12._4_4_ = pfVar1[1] + pfVar2[1];
        auVar12._8_4_ = pfVar1[2] + pfVar2[2];
        auVar12._12_4_ = pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])((long)pvVar9->m + lVar7) = auVar12;
        pvVar9 = pvVar9 + (stride << (bVar4 & 0x1f));
      }
      bVar10 = 5 < uVar5;
      uVar5 = uVar6;
    } while (bVar10);
  }
  return;
}

Assistant:

static void brent_kung_prefix_sum(
	vfloat4* d,
	size_t items,
	int stride
) {
	if (items < 2)
		return;

	size_t lc_stride = 2;
	size_t log2_stride = 1;

	// The reduction-tree loop
	do {
		size_t step = lc_stride >> 1;
		size_t start = lc_stride - 1;
		size_t iters = items >> log2_stride;

		vfloat4 *da = d + (start * stride);
		ptrdiff_t ofs = -static_cast<ptrdiff_t>(step * stride);
		size_t ofs_stride = stride << log2_stride;

		while (iters)
		{
			*da = *da + da[ofs];
			da += ofs_stride;
			iters--;
		}

		log2_stride += 1;
		lc_stride <<= 1;
	} while (lc_stride <= items);

	// The expansion-tree loop
	do {
		log2_stride -= 1;
		lc_stride >>= 1;

		size_t step = lc_stride >> 1;
		size_t start = step + lc_stride - 1;
		size_t iters = (items - step) >> log2_stride;

		vfloat4 *da = d + (start * stride);
		ptrdiff_t ofs = -static_cast<ptrdiff_t>(step * stride);
		size_t ofs_stride = stride << log2_stride;

		while (iters)
		{
			*da = *da + da[ofs];
			da += ofs_stride;
			iters--;
		}
	} while (lc_stride > 2);
}